

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_map(void)

{
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  basic_variable<std::allocator<char>_> *local_4d0;
  type *local_4b8;
  basic_variable<std::allocator<char>_> *local_4a0;
  basic_variable<std::allocator<char>_> *local_488;
  basic_variable<std::allocator<char>_> *local_470;
  basic_variable<std::allocator<char>_> *local_458;
  undefined8 local_418;
  value_type expected [28];
  undefined1 local_3f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 auStack_368 [32];
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 auStack_2e8 [32];
  basic_variable<std::allocator<char>_> local_2c8;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 auStack_268 [32];
  type local_248;
  basic_variable<std::allocator<char>_> local_218;
  type local_1e8;
  nullable local_1c4;
  basic_variable<std::allocator<char>_> *local_1c0;
  basic_variable<std::allocator<char>_> local_1b8;
  basic_variable<std::allocator<char>_> local_188;
  undefined1 auStack_158 [32];
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  auStack_158._24_8_ = &local_138;
  local_1c0 = &local_1b8;
  local_1c4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1c0,&local_1c4);
  local_1c0 = &local_188;
  local_1e8._16_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (local_1c0,(nullable *)(local_1e8.__data + 0x10));
  auStack_158._8_8_ = &local_1b8;
  auStack_158._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_138,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_158 + 8));
  auStack_268._24_8_ = &local_248;
  auStack_158._24_8_ = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_268._24_8_,true);
  auStack_268._24_8_ = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_268._24_8_,true);
  local_1e8._0_8_ = &local_248;
  local_1e8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_108,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_1e8.__align);
  auStack_2e8._24_8_ = &local_2c8;
  auStack_158._24_8_ = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_2e8._24_8_,2);
  auStack_2e8._24_8_ = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_2e8._24_8_,2);
  auStack_268._8_8_ = &local_2c8;
  auStack_268._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_268 + 8));
  auStack_368._24_8_ = &local_348;
  auStack_158._24_8_ = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)auStack_368._24_8_,3.0);
  auStack_368._24_8_ = &local_318;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)auStack_368._24_8_,3.0);
  auStack_2e8._8_8_ = &local_348;
  auStack_2e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_2e8 + 8));
  auStack_158._24_8_ = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,"ABC");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,"ABC");
  auStack_368._8_8_ = &local_3c8;
  auStack_368._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_368 + 8));
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_48._0_8_ = &local_138;
  local_48._8_8_ = 5;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_458 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_458 = local_458 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_458);
  } while (local_458 != &local_138);
  local_470 = (basic_variable<std::allocator<char>_> *)auStack_368;
  do {
    local_470 = local_470 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_470);
  } while (local_470 != &local_3c8);
  local_488 = (basic_variable<std::allocator<char>_> *)auStack_2e8;
  do {
    local_488 = local_488 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_488);
  } while (local_488 != &local_348);
  local_4a0 = (basic_variable<std::allocator<char>_> *)auStack_268;
  do {
    local_4a0 = local_4a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_4a0);
  } while (local_4a0 != &local_2c8);
  local_4b8 = &local_1e8;
  do {
    local_4b8 = (type *)((long)local_4b8 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_4b8->__align);
  } while (local_4b8 != &local_248);
  local_4d0 = (basic_variable<std::allocator<char>_> *)auStack_158;
  do {
    local_4d0 = local_4d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_4d0);
  } while (local_4d0 != &local_1b8);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0,(bintoken *)local_38
             ,data_00);
  expected[8] = '@';
  expected[9] = 0xa9;
  expected[10] = '\x03';
  expected[0xb] = 'A';
  expected[0xc] = 'B';
  expected[0xd] = 'C';
  expected[0xe] = 0xa9;
  expected[0xf] = '\x03';
  expected[0x10] = 'A';
  expected[0x11] = 'B';
  expected[0x12] = 'C';
  expected[0x13] = 0x9f;
  local_418 = 0xc50202818182829e;
  expected[0] = '\0';
  expected[1] = '\0';
  expected[2] = '@';
  expected[3] = '@';
  expected[4] = 0xc5;
  expected[5] = '\0';
  expected[6] = '\0';
  expected[7] = '@';
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x168,"void formatter_suite::format_map()",iVar1._M_current,iVar2._M_current,
             &local_418,expected + 0x14);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void format_map()
{
    variable data =
        {
            { null, null },
            { true, true },
            { 2, 2 },
            { 3.0f, 3.0f },
            { "ABC", "ABC" }
        };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_assoc_array,
        bintoken::token::code::null,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        bintoken::token::code::true_value,
        0x02,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::end_assoc_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}